

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

void __thiscall crnlib::adaptive_huffman_data_model::reset(adaptive_huffman_data_model *this)

{
  uint i;
  ulong uVar1;
  
  if (this->m_total_syms != 0) {
    uVar1 = 0;
    do {
      (this->m_sym_freq).m_p[uVar1] = 1;
      uVar1 = uVar1 + 1;
    } while (uVar1 < this->m_total_syms);
    this->m_total_count = 0;
    this->m_update_cycle = this->m_total_syms;
    update(this);
    this->m_update_cycle = 8;
    this->m_symbols_until_update = 8;
  }
  return;
}

Assistant:

void adaptive_huffman_data_model::reset() {
  if (!m_total_syms)
    return;

  for (uint i = 0; i < m_total_syms; i++)
    m_sym_freq[i] = 1;

  m_total_count = 0;
  m_update_cycle = m_total_syms;

  update();

  m_symbols_until_update = m_update_cycle = 8;  //(m_total_syms + 6) >> 1;
}